

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_menu_begin_image_text
                  (nk_context *ctx,char *title,int len,nk_flags align,nk_image img,nk_vec2 size)

{
  nk_window *win;
  nk_widget_layout_states nVar1;
  nk_bool nVar2;
  int iVar3;
  nk_context *in;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  nk_rect bounds;
  nk_rect header_00;
  nk_rect header;
  nk_rect local_68;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  nk_rect local_48;
  undefined1 local_38 [16];
  
  nVar1 = NK_WIDGET_INVALID;
  if (((ctx != (nk_context *)0x0) &&
      (win = ctx->current, nVar1 = NK_WIDGET_INVALID, win != (nk_window *)0x0)) &&
     (win->layout != (nk_panel *)0x0)) {
    local_38._8_4_ = in_XMM0_Dc;
    local_38._0_8_ = size;
    local_38._12_4_ = in_XMM0_Dd;
    nVar1 = nk_widget(&local_68,ctx);
    if (nVar1 != NK_WIDGET_INVALID) {
      if (nVar1 == NK_WIDGET_ROM) {
        in = (nk_context *)0x0;
      }
      else {
        in = (nk_context *)0x0;
        if ((win->layout->flags & 0x1000) == 0) {
          in = ctx;
        }
      }
      local_48.x = local_68.x;
      local_48.y = local_68.y;
      local_48.w = 0.0;
      local_48.h = 0.0;
      local_58 = local_68.w;
      fStack_54 = local_68.h;
      uStack_50 = 0;
      bounds.w = local_68.w;
      bounds.h = local_68.h;
      bounds.x = local_68.x;
      bounds.y = local_68.y;
      nVar2 = nk_do_button_text_image
                        (&ctx->last_widget_state,&win->buffer,bounds,img,title,len,align,
                         NK_BUTTON_DEFAULT,&(ctx->style).menu_button,(ctx->style).font,&in->input);
      header_00.w = local_58;
      header_00.h = fStack_54;
      header_00.x = local_48.x;
      header_00.y = local_48.y;
      iVar3 = nk_menu_begin(ctx,win,title,(uint)(nVar2 != 0),header_00,(nk_vec2)local_38._0_8_);
      return iVar3;
    }
  }
  return nVar1;
}

Assistant:

NK_API nk_bool
nk_menu_begin_image_text(struct nk_context *ctx, const char *title, int len,
nk_flags align, struct nk_image img, struct nk_vec2 size)
{
struct nk_window *win;
struct nk_rect header;
const struct nk_input *in;
int is_clicked = nk_false;
nk_flags state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
state = nk_widget(&header, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_text_image(&ctx->last_widget_state, &win->buffer,
header, img, title, len, align, NK_BUTTON_DEFAULT, &ctx->style.menu_button,
ctx->style.font, in))
is_clicked = nk_true;
return nk_menu_begin(ctx, win, title, is_clicked, header, size);
}